

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O3

void P_AutoUseHealth(player_t *player,int saveHealth)

{
  uint uVar1;
  AInventory *pAVar2;
  PClass *pPVar3;
  int iVar4;
  int iVar5;
  AInventory *pAVar6;
  undefined4 extraout_var;
  ulong uVar8;
  int iVar9;
  TArray<AInventory_*,_AInventory_*> *this;
  bool bVar10;
  TArray<AInventory_*,_AInventory_*> LargeHealthItems;
  TArray<AInventory_*,_AInventory_*> NormalHealthItems;
  int local_5c;
  TArray<AInventory_*,_AInventory_*> local_58;
  TArray<AInventory_*,_AInventory_*> local_48;
  PClass *pPVar7;
  
  local_48.Array = (AInventory **)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  local_58.Array = (AInventory **)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  pAVar2 = (player->mo->super_AActor).Inventory.field_0.p;
  iVar9 = 0;
  iVar4 = 0;
  local_5c = saveHealth;
  if (pAVar2 != (AInventory *)0x0) {
    if (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      do {
        pAVar6 = pAVar2;
        pPVar3 = AHealthPickup::RegistrationInfo.MyClass;
        if (0 < pAVar6->Amount) {
          pPVar7 = (pAVar6->super_AActor).super_DThinker.super_DObject.Class;
          if (pPVar7 == (PClass *)0x0) {
            iVar4 = (**(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar6);
            pPVar7 = (PClass *)CONCAT44(extraout_var,iVar4);
            (pAVar6->super_AActor).super_DThinker.super_DObject.Class = pPVar7;
          }
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar3 && bVar10) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar10 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar3) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          if (bVar10) {
            if (*(int *)&pAVar6->field_0x4fc == 2) {
              this = &local_58;
              TArray<AInventory_*,_AInventory_*>::Grow(this,1);
            }
            else {
              if (*(int *)&pAVar6->field_0x4fc != 1) goto LAB_003fe2f5;
              TArray<AInventory_*,_AInventory_*>::Grow(&local_48,1);
              this = &local_48;
            }
            uVar1 = this->Count;
            this->Array[uVar1] = pAVar6;
            this->Count = uVar1 + 1;
          }
        }
LAB_003fe2f5:
        pAVar2 = (pAVar6->super_AActor).Inventory.field_0.p;
        if (pAVar2 == (AInventory *)0x0) goto LAB_003fe318;
      } while (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0);
      (pAVar6->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
LAB_003fe318:
      iVar4 = 0;
      if ((ulong)local_48._8_8_ >> 0x20 != 0) {
        uVar8 = 0;
        iVar4 = 0;
        do {
          iVar4 = iVar4 + (local_48.Array[uVar8]->super_AActor).health *
                          local_48.Array[uVar8]->Amount;
          uVar8 = uVar8 + 1;
        } while ((ulong)local_48._8_8_ >> 0x20 != uVar8);
      }
    }
    else {
      (player->mo->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      iVar4 = 0;
    }
  }
  if ((ulong)local_58._8_8_ >> 0x20 != 0) {
    uVar8 = 0;
    iVar9 = 0;
    do {
      iVar9 = iVar9 + (local_58.Array[uVar8]->super_AActor).health * local_58.Array[uVar8]->Amount;
      uVar8 = uVar8 + 1;
    } while ((ulong)local_58._8_8_ >> 0x20 != uVar8);
  }
  iVar5 = G_SkillProperty(SKILLP_AutoUseHealth);
  if ((iVar5 == 0) || (iVar4 < local_5c)) {
    if (iVar9 < local_5c) {
      if ((iVar5 == 0) || (iVar9 + iVar4 < local_5c)) {
        iVar9 = player->health;
        goto LAB_003fe413;
      }
      iVar9 = UseHealthItems(&local_48,&local_5c);
      iVar9 = iVar9 + player->health;
      player->health = iVar9;
      if (local_5c < 1) goto LAB_003fe413;
      iVar9 = UseHealthItems(&local_58,&local_5c);
    }
    else {
      iVar9 = UseHealthItems(&local_58,&local_5c);
    }
  }
  else {
    iVar9 = UseHealthItems(&local_48,&local_5c);
  }
  iVar9 = iVar9 + player->health;
  player->health = iVar9;
LAB_003fe413:
  (player->mo->super_AActor).health = iVar9;
  TArray<AInventory_*,_AInventory_*>::~TArray(&local_58);
  TArray<AInventory_*,_AInventory_*>::~TArray(&local_48);
  return;
}

Assistant:

void P_AutoUseHealth(player_t *player, int saveHealth)
{
	TArray<AInventory *> NormalHealthItems;
	TArray<AInventory *> LargeHealthItems;

	for(AInventory *inv = player->mo->Inventory; inv != NULL; inv = inv->Inventory)
	{
		if (inv->Amount > 0 && inv->IsKindOf(RUNTIME_CLASS(AHealthPickup)))
		{
			int mode = static_cast<AHealthPickup*>(inv)->autousemode;

			if (mode == 1) NormalHealthItems.Push(inv);
			else if (mode == 2) LargeHealthItems.Push(inv);
		}
	}

	int normalhealth = CountHealth(NormalHealthItems);
	int largehealth = CountHealth(LargeHealthItems);

	bool skilluse = !!G_SkillProperty(SKILLP_AutoUseHealth);

	if (skilluse && normalhealth >= saveHealth)
	{ // Use quartz flasks
		player->health += UseHealthItems(NormalHealthItems, saveHealth);
	}
	else if (largehealth >= saveHealth)
	{ 
		// Use mystic urns
		player->health += UseHealthItems(LargeHealthItems, saveHealth);
	}
	else if (skilluse && normalhealth + largehealth >= saveHealth)
	{ // Use mystic urns and quartz flasks
		player->health += UseHealthItems(NormalHealthItems, saveHealth);
		if (saveHealth > 0) player->health += UseHealthItems(LargeHealthItems, saveHealth);
	}
	player->mo->health = player->health;
}